

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_identify(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint *puVar6;
  char *pcVar7;
  char *pcVar8;
  long in_RCX;
  char_data *in_RDX;
  int lorebonus;
  OBJ_APPLY_DATA *app;
  char buf [4608];
  OBJ_DATA *obj;
  undefined4 in_stack_ffffffffffffed68;
  int in_stack_ffffffffffffed6c;
  undefined8 in_stack_ffffffffffffed70;
  CProficiencies *pCVar9;
  undefined4 in_stack_ffffffffffffed78;
  int in_stack_ffffffffffffed7c;
  CProficiencies *in_stack_ffffffffffffed80;
  uint local_126c;
  undefined8 in_stack_ffffffffffffed98;
  int local_1238;
  uint local_1234;
  long local_1230;
  CProficiencies local_1228;
  long *in_stack_ffffffffffffee50;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffed98 >> 0x20);
  local_1234 = 0;
  bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed6c,in_stack_ffffffffffffed68));
  if (!bVar2) {
    char_data::Profs(in_RDX);
    uVar3 = CProficiencies::GetProf
                      (in_stack_ffffffffffffed80,
                       (char *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
    local_1234 = (uint)(uVar3 < 0x80000000);
    if (uVar3 < 0x80000000) {
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      char_data::Profs(in_RDX);
      CProficiencies::CheckImprove
                (in_stack_ffffffffffffed80,
                 (char *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
                 (int)((ulong)in_stack_ffffffffffffed70 >> 0x20));
    }
  }
  iVar4 = (int)in_stack_ffffffffffffed70;
  local_1238 = 0;
  puVar6 = (uint *)std::max<int>((int *)&local_1234,&local_1238);
  local_1234 = *puVar6;
  uVar1 = *(undefined8 *)(in_RCX + 0x80);
  pcVar7 = item_name_lookup(iVar5);
  pcVar8 = extra_bit_name(in_stack_ffffffffffffee50);
  sprintf((char *)&local_1228,"Object \'%s\' is type %s, extra flags %s.\n\r",uVar1,pcVar7,pcVar8);
  strcat((char *)&local_1228,"It appears to be made of ");
  strcat((char *)&local_1228,*(char **)(in_RCX + 0x110));
  strcat((char *)&local_1228,".\n\r");
  send_to_char((char *)in_stack_ffffffffffffed80,
               (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
  switch(*(undefined2 *)(in_RCX + 0x98)) {
  case 2:
  case 10:
  case 0x1a:
    sprintf((char *)&local_1228,"It is enchanted with level %d spells of:",
            (ulong)*(uint *)(in_RCX + 0x11c));
    send_to_char((char *)in_stack_ffffffffffffed80,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
    if (((-1 < *(int *)(in_RCX + 0x120)) && (*(int *)(in_RCX + 0x120) < 800)) &&
       (bVar2 = str_cmp(skill_table[*(int *)(in_RCX + 0x120)].name,"reserved"), bVar2)) {
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
    }
    if (((-1 < *(int *)(in_RCX + 0x124)) && (*(int *)(in_RCX + 0x124) < 800)) &&
       (bVar2 = str_cmp(skill_table[*(int *)(in_RCX + 0x124)].name,"reserved"), bVar2)) {
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
    }
    if (((-1 < *(int *)(in_RCX + 0x128)) && (*(int *)(in_RCX + 0x128) < 800)) &&
       (bVar2 = str_cmp(skill_table[*(int *)(in_RCX + 0x128)].name,"reserved"), bVar2)) {
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
    }
    if (((-1 < *(int *)(in_RCX + 300)) && (*(int *)(in_RCX + 300) < 800)) &&
       (bVar2 = str_cmp(skill_table[*(int *)(in_RCX + 300)].name,"reserved"), bVar2)) {
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
    }
    send_to_char((char *)in_stack_ffffffffffffed80,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
    break;
  case 3:
  case 4:
    sprintf((char *)&local_1228,"It is enchanted with %d charges of level %d",
            (ulong)*(uint *)(in_RCX + 0x124),(ulong)*(uint *)(in_RCX + 0x11c));
    send_to_char((char *)in_stack_ffffffffffffed80,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
    if (((-1 < *(int *)(in_RCX + 0x128)) && (*(int *)(in_RCX + 0x128) < 800)) &&
       (bVar2 = str_cmp(skill_table[*(int *)(in_RCX + 0x128)].name,"reserved"), bVar2)) {
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
    }
    send_to_char((char *)in_stack_ffffffffffffed80,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
    break;
  case 5:
    send_to_char((char *)in_stack_ffffffffffffed80,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
    switch(*(undefined4 *)(in_RCX + 0x11c)) {
    case 0:
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      break;
    case 1:
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      break;
    case 2:
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      break;
    case 3:
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      break;
    case 4:
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      break;
    case 5:
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      break;
    case 6:
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      break;
    case 7:
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      break;
    case 8:
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      break;
    case 9:
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      break;
    default:
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
    }
    if (local_1234 == 0) {
      in_stack_ffffffffffffed80 = &local_1228;
      in_stack_ffffffffffffed7c = ((*(int *)(in_RCX + 0x124) + 1) * *(int *)(in_RCX + 0x120)) / 2;
      iVar5 = number_range(iVar4,in_stack_ffffffffffffed6c);
      sprintf((char *)in_stack_ffffffffffffed80,"The average damage is probably around %d.\n\r",
              (ulong)(uint)(in_stack_ffffffffffffed7c + iVar5));
    }
    else {
      sprintf((char *)&local_1228,"Damage averages %d.\n\r",
              (long)((*(int *)(in_RCX + 0x124) + 1) * *(int *)(in_RCX + 0x120)) / 2 & 0xffffffff);
    }
    send_to_char((char *)in_stack_ffffffffffffed80,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
    break;
  case 9:
    sprintf((char *)&local_1228,"Armor class averages %d.\n\r",
            (long)(*(int *)(in_RCX + 0x11c) + *(int *)(in_RCX + 0x120) + *(int *)(in_RCX + 0x124) +
                  *(int *)(in_RCX + 0x128)) / 4 & 0xffffffff);
    if (local_1234 != 0) {
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
    }
    break;
  case 0xf:
    pCVar9 = &local_1228;
    pcVar7 = "might be able to";
    if (local_1234 == 0) {
      iVar5 = *(int *)(in_RCX + 0x11c);
      iVar4 = number_range(iVar4,in_stack_ffffffffffffed6c);
      local_126c = iVar5 + iVar4;
    }
    else {
      pcVar7 = "can";
      local_126c = *(uint *)(in_RCX + 0x11c);
    }
    sprintf((char *)pCVar9,"It %s contain about %d objects.\n\r",pcVar7,(ulong)local_126c);
    send_to_char((char *)in_stack_ffffffffffffed80,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
  }
  for (local_1230 = *(long *)(in_RCX + 0x38); local_1230 != 0;
      local_1230 = *(long *)(local_1230 + 8)) {
    pCVar9 = &local_1228;
    pcVar7 = affect_loc_name(in_stack_ffffffffffffed7c);
    sprintf((char *)pCVar9,"Affects %s by %d.\n\r",pcVar7,
            (ulong)(uint)(int)*(short *)(local_1230 + 4));
    send_to_char((char *)in_stack_ffffffffffffed80,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
  }
  return;
}

Assistant:

void spell_identify(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	OBJ_DATA *obj = (OBJ_DATA *)vo;
	char buf[MAX_STRING_LENGTH];
	OBJ_APPLY_DATA *app;
	int lorebonus = 0;

	if (!is_npc(ch) && (lorebonus = ch->Profs()->GetProf("forgotten lore") > -1))
	{
		send_to_char("Your knowledge of forgotten lore grants you additional insight.\n\r", ch);
		ch->Profs()->CheckImprove("forgotten lore", 100);
	}

	lorebonus = std::max(lorebonus, 0);

	sprintf(buf, "Object '%s' is type %s, extra flags %s.\n\r",
		obj->name,
		item_name_lookup(obj->item_type),
		extra_bit_name(obj->extra_flags));
	strcat(buf, "It appears to be made of ");
	strcat(buf, obj->material);
	strcat(buf, ".\n\r");
	send_to_char(buf, ch);

	switch (obj->item_type)
	{
		case ITEM_SCROLL:
		case ITEM_POTION:
		case ITEM_PILL:
			sprintf(buf, "It is enchanted with level %d spells of:", obj->value[0]);
			send_to_char(buf, ch);

			if (obj->value[1] >= 0 && obj->value[1] < MAX_SKILL && str_cmp(skill_table[obj->value[1]].name, "reserved"))
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[1]].name, ch);
				send_to_char("'", ch);
			}

			if (obj->value[2] >= 0 && obj->value[2] < MAX_SKILL && str_cmp(skill_table[obj->value[2]].name, "reserved"))
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[2]].name, ch);
				send_to_char("'", ch);
			}

			if (obj->value[3] >= 0 && obj->value[3] < MAX_SKILL && str_cmp(skill_table[obj->value[3]].name, "reserved"))
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[3]].name, ch);
				send_to_char("'", ch);
			}

			if (obj->value[4] >= 0 && obj->value[4] < MAX_SKILL && str_cmp(skill_table[obj->value[4]].name, "reserved"))
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[4]].name, ch);
				send_to_char("'", ch);
			}

			send_to_char(".\n\r", ch);
			break;
		case ITEM_WAND:
		case ITEM_STAFF:
			sprintf(buf, "It is enchanted with %d charges of level %d", obj->value[2], obj->value[0]);
			send_to_char(buf, ch);

			if (obj->value[3] >= 0 && obj->value[3] < MAX_SKILL && str_cmp(skill_table[obj->value[3]].name, "reserved"))
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[3]].name, ch);
				send_to_char("'", ch);
			}

			send_to_char(".\n\r", ch);
			break;
		case ITEM_CONTAINER:
			sprintf(buf, "It %s contain about %d objects.\n\r",
				lorebonus ? "can" : "might be able to",
				lorebonus ? obj->value[0] : obj->value[0] + number_range(obj->value[0] * -1 / 2, obj->value[0] * 1 / 2));
			send_to_char(buf, ch);

			break;
		case ITEM_WEAPON:
			send_to_char("It appears to be a", ch);

			switch (obj->value[0])
			{
				case WEAPON_EXOTIC:
					send_to_char("n exotic.\n\r", ch);
					break;
				case WEAPON_SWORD:
					send_to_char(" sword.\n\r", ch);
					break;
				case WEAPON_DAGGER:
					send_to_char(" dagger.\n\r", ch);
					break;
				case WEAPON_SPEAR:
					send_to_char(" spear/staff.\n\r", ch);
					break;
				case WEAPON_MACE:
					send_to_char(" mace/club.\n\r", ch);
					break;
				case WEAPON_AXE:
					send_to_char("n axe.\n\r", ch);
					break;
				case WEAPON_FLAIL:
					send_to_char(" flail.\n\r", ch);
					break;
				case WEAPON_WHIP:
					send_to_char(" whip.\n\r", ch);
					break;
				case WEAPON_POLEARM:
					send_to_char(" polearm.\n\r", ch);
					break;
				case WEAPON_STAFF:
					send_to_char(" staff.\n\r", ch);
					break;
				default:
					send_to_char(" weapon of unknown species.\n\r", ch);
					break;
			}

			if (lorebonus)
				sprintf(buf, "Damage averages %d.\n\r", (1 + obj->value[2]) * obj->value[1] / 2);
			else
				sprintf(buf, "The average damage is probably around %d.\n\r", ((1 + obj->value[2]) * obj->value[1] / 2) + number_range(-5, 3));

			send_to_char(buf, ch);
			break;
		case ITEM_ARMOR:
			sprintf(buf, "Armor class averages %d.\n\r", (obj->value[0] + obj->value[1] + obj->value[2] + obj->value[3]) / 4);

			if (lorebonus)
				send_to_char(buf, ch);

			break;
	}

	for (app = obj->apply; app; app = app->next)
	{
		sprintf(buf, "Affects %s by %d.\n\r", affect_loc_name(app->location), app->modifier);
		send_to_char(buf, ch);
	}
}